

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_dcread(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i64 EA_00;
  TCGv_i64 val_00;
  TCGv_i64 val;
  TCGv_i64 EA;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ctx->pr & 1U) == 0) {
    gen_set_access_type(ctx,0x60);
    EA_00 = tcg_temp_new_i64(tcg_ctx_00);
    gen_addr_reg_index(ctx,EA_00);
    val_00 = tcg_temp_new_i64(tcg_ctx_00);
    gen_qemu_ld32u(ctx,val_00,EA_00);
    tcg_temp_free_i64(tcg_ctx_00,val_00);
    uVar1 = rD(ctx->opcode);
    tcg_gen_mov_i64_ppc64(tcg_ctx_00,cpu_gpr[uVar1],EA_00);
    tcg_temp_free_i64(tcg_ctx_00,EA_00);
  }
  else {
    gen_priv_exception(ctx,1);
  }
  return;
}

Assistant:

static void gen_dcread(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv EA, val;

    CHK_SV;
    gen_set_access_type(ctx, ACCESS_CACHE);
    EA = tcg_temp_new(tcg_ctx);
    gen_addr_reg_index(ctx, EA);
    val = tcg_temp_new(tcg_ctx);
    gen_qemu_ld32u(ctx, val, EA);
    tcg_temp_free(tcg_ctx, val);
    tcg_gen_mov_tl(tcg_ctx, cpu_gpr[rD(ctx->opcode)], EA);
    tcg_temp_free(tcg_ctx, EA);
}